

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall QtPrivate::QGenericArrayOps<QString>::eraseLast(QGenericArrayOps<QString> *this)

{
  qsizetype *pqVar1;
  QString *pQVar2;
  long lVar3;
  Data *pDVar4;
  
  pQVar2 = (this->super_QArrayDataPointer<QString>).ptr;
  lVar3 = (this->super_QArrayDataPointer<QString>).size;
  pDVar4 = pQVar2[lVar3 + -1].d.d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(pQVar2[lVar3 + -1].d.d)->super_QArrayData,2,0x10);
    }
  }
  pqVar1 = &(this->super_QArrayDataPointer<QString>).size;
  *pqVar1 = *pqVar1 + -1;
  return;
}

Assistant:

void eraseLast() noexcept
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(this->size);
        (this->end() - 1)->~T();
        --this->size;
    }